

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O1

int pospopcnt_u16_avx512bw_blend_popcnt(uint16_t *data,uint32_t len,uint32_t *flags)

{
  int *piVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  undefined8 uVar6;
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  
  if (len < 0x40) {
    uVar4 = 0;
  }
  else {
    auVar8 = vpbroadcastd_avx512f(ZEXT416(0xff00ff));
    auVar9 = vpbroadcastd_avx512f(ZEXT416(0xff00ff00));
    uVar3 = 0;
    uVar2 = 2;
    do {
      uVar4 = uVar2;
      auVar10 = vmovdqu64_avx512f(*(undefined1 (*) [64])(data + uVar3 * 0x20));
      auVar11 = vmovdqu64_avx512f(*(undefined1 (*) [64])(data + uVar3 * 0x20 + 0x20));
      auVar7 = vpsllw_avx512bw(auVar11,8);
      auVar7 = vpternlogd_avx512f(auVar7,auVar10,auVar8,0xf8);
      auVar11 = vpsrlw_avx512bw(auVar11,8);
      auVar10 = vpternlogd_avx512f(auVar11,auVar10,auVar9,0xf8);
      lVar5 = 0x20;
      do {
        uVar6 = vpmovb2m_avx512bw(auVar7);
        piVar1 = (int *)((long)flags + lVar5 + -4);
        *piVar1 = *piVar1 + (int)POPCOUNT(uVar6);
        uVar6 = vpmovb2m_avx512bw(auVar10);
        piVar1 = (int *)((long)flags + lVar5 + 0x1c);
        *piVar1 = *piVar1 + (int)POPCOUNT(uVar6);
        auVar7 = vpaddb_avx512bw(auVar7,auVar7);
        auVar10 = vpaddb_avx512bw(auVar10,auVar10);
        lVar5 = lVar5 + -4;
      } while (lVar5 != 0);
      uVar3 = uVar4;
      uVar2 = uVar4 + 2;
    } while (uVar4 + 2 <= (ulong)(len >> 5));
    uVar4 = uVar4 << 5;
  }
  if (uVar4 < len) {
    auVar8 = vmovdqu64_avx512f(*(undefined1 (*) [64])flags);
    auVar9 = vpmovsxbd_avx512f(_DAT_0011a080);
    auVar10 = vpbroadcastd_avx512f(ZEXT416(1));
    do {
      auVar11 = vpbroadcastd_avx512f();
      auVar11 = vpsrlvd_avx512f(auVar11,auVar9);
      auVar11 = vpandd_avx512f(auVar11,auVar10);
      auVar8 = vpaddd_avx512f(auVar11,auVar8);
      uVar4 = uVar4 + 1;
    } while (len != uVar4);
    auVar8 = vmovdqu64_avx512f(auVar8);
    *(undefined1 (*) [64])flags = auVar8;
  }
  return 0;
}

Assistant:

int pospopcnt_u16_avx512bw_blend_popcnt(const uint16_t* data, uint32_t len, uint32_t* flags) { 
    const __m512i* data_vectors = (const __m512i*)(data);
    const uint32_t n_cycles = len / 32;

    size_t i = 0;
    for (/**/; i + 2 <= n_cycles; i += 2) {
        __m512i v0 = _mm512_loadu_si512(data_vectors + i + 0);
        __m512i v1 = _mm512_loadu_si512(data_vectors + i + 1);

        __m512i input0 = _mm512_ternarylogic_epi32(v0, _mm512_set1_epi16(0x00FF), _mm512_slli_epi16(v1, 8), AND_OR);
        __m512i input1 = _mm512_ternarylogic_epi32(v0, _mm512_set1_epi16((int16_t)0xFF00), _mm512_srli_epi16(v1, 8), AND_OR);
        
        for (int i = 0; i < 8; ++i) {
            flags[ 7 - i] += _mm_popcnt_u64(_mm512_movepi8_mask(input0));
            flags[15 - i] += _mm_popcnt_u64(_mm512_movepi8_mask(input1));
            input0 = _mm512_add_epi8(input0, input0);
            input1 = _mm512_add_epi8(input1, input1);
        }
    }

    i *= 32;
    for (/**/; i < len; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += ((data[i] & (1 << j)) >> j);
        }
    }

    return 0;
}